

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

void __thiscall
pbrt::SummedAreaTable::SummedAreaTable(SummedAreaTable *this,Array2D<float> *values,Allocator alloc)

{
  float fVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  float *pfVar6;
  double *pdVar7;
  int iVar8;
  int y;
  long lVar9;
  int y_1;
  int y_00;
  Tuple2<pbrt::Point2,_int> TVar10;
  Tuple2<pbrt::Point2,_int> p;
  
  Array2D<double>::Array2D
            (&this->sum,
             (values->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x -
             (values->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x,
             (values->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y -
             (values->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y,
             (allocator_type)alloc.memoryResource);
  pfVar6 = Array2D<float>::operator[](values,(Point2i)0x0);
  fVar1 = *pfVar6;
  pdVar7 = Array2D<double>::operator[](&this->sum,(Point2i)0x0);
  *pdVar7 = (double)fVar1;
  TVar10.x = 1;
  TVar10.y = 0;
  for (; (long)TVar10 <
         (long)(this->sum).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
         (long)(this->sum).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      TVar10 = (Tuple2<pbrt::Point2,_int>)((long)TVar10 + 1)) {
    pfVar6 = Array2D<float>::operator[](values,(Point2i)TVar10);
    fVar1 = *pfVar6;
    pdVar7 = Array2D<double>::operator[](&this->sum,(Point2i)(TVar10 + -1));
    dVar2 = *pdVar7;
    pdVar7 = Array2D<double>::operator[](&this->sum,(Point2i)TVar10);
    *pdVar7 = (double)fVar1 + dVar2;
  }
  lVar9 = 1;
  p.x = 0;
  p.y = 0;
  while( true ) {
    iVar8 = (this->sum).extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
    iVar5 = (this->sum).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
    if (iVar8 - iVar5 <= lVar9) break;
    TVar10 = (Tuple2<pbrt::Point2,_int>)((long)p + 0x100000000);
    pfVar6 = Array2D<float>::operator[](values,(Point2i)TVar10);
    fVar1 = *pfVar6;
    pdVar7 = Array2D<double>::operator[](&this->sum,(Point2i)p);
    dVar2 = *pdVar7;
    pdVar7 = Array2D<double>::operator[](&this->sum,(Point2i)TVar10);
    lVar9 = lVar9 + 1;
    *pdVar7 = (double)fVar1 + dVar2;
    p = TVar10;
  }
  for (y_00 = 1; y_00 < iVar8 - iVar5; y_00 = y_00 + 1) {
    for (iVar8 = 1;
        iVar8 < (this->sum).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                (this->sum).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x; iVar8 = iVar8 + 1) {
      pfVar6 = Array2D<float>::operator()(values,iVar8,y_00);
      fVar1 = *pfVar6;
      pdVar7 = Array2D<double>::operator()(&this->sum,iVar8 + -1,y_00);
      dVar2 = *pdVar7;
      pdVar7 = Array2D<double>::operator()(&this->sum,iVar8,y_00 + -1);
      dVar3 = *pdVar7;
      pdVar7 = Array2D<double>::operator()(&this->sum,iVar8 + -1,y_00 + -1);
      dVar4 = *pdVar7;
      pdVar7 = Array2D<double>::operator()(&this->sum,iVar8,y_00);
      *pdVar7 = ((double)fVar1 + dVar2 + dVar3) - dVar4;
    }
    iVar5 = (this->sum).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
    iVar8 = (this->sum).extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
  }
  return;
}

Assistant:

SummedAreaTable(const Array2D<Float> &values, Allocator alloc = {})
        : sum(values.xSize(), values.ySize(), alloc) {
        sum(0, 0) = values(0, 0);
        // Compute sums along first scanline and column
        for (int x = 1; x < sum.xSize(); ++x)
            sum(x, 0) = values(x, 0) + sum(x - 1, 0);
        for (int y = 1; y < sum.ySize(); ++y)
            sum(0, y) = values(0, y) + sum(0, y - 1);

        // Compute sums for the remainder of the entries
        for (int y = 1; y < sum.ySize(); ++y)
            for (int x = 1; x < sum.xSize(); ++x)
                sum(x, y) =
                    (values(x, y) + sum(x - 1, y) + sum(x, y - 1) - sum(x - 1, y - 1));
    }